

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O2

void __thiscall ItemTable::WhiteRoomFour(ItemTable *this)

{
  ItemWrapper *this_00;
  mapped_type *ppIVar1;
  key_type local_5c;
  string local_58;
  Item local_38;
  
  this_00 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_58,"Light",(allocator *)&local_5c);
  Item::Item(&local_38,&local_58,LIGHT);
  ItemWrapper::ItemWrapper(this_00,&local_38,W_ROOM4);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  local_5c = LIGHT;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_5c);
  *ppIVar1 = this_00;
  return;
}

Assistant:

void ItemTable::WhiteRoomFour() {

    ItemWrapper * Light = new ItemWrapper(Item("Light", LIGHT), W_ROOM4);

    items[LIGHT] = Light;

}